

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

bool __thiscall re2::RE2::CheckRewriteString(RE2 *this,StringPiece *rewrite,string *error)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  
  lVar7 = (long)rewrite->length_;
  bVar10 = 0 < lVar7;
  if (lVar7 < 1) {
    uVar6 = 0xffffffff;
  }
  else {
    pcVar9 = rewrite->ptr_;
    pcVar8 = pcVar9 + lVar7;
    uVar6 = 0xffffffff;
    do {
      bVar1 = false;
      if (*pcVar9 == '\\') {
        pcVar9 = pcVar9 + 1;
        if (pcVar9 == pcVar8) {
          pcVar5 = (char *)error->_M_string_length;
          pcVar4 = "Rewrite schema error: \'\\\' not allowed at end.";
LAB_00136192:
          std::__cxx11::string::_M_replace((ulong)error,0,pcVar5,(ulong)pcVar4);
          bVar1 = true;
        }
        else if (*pcVar9 != 0x5c) {
          uVar3 = (int)*pcVar9 - 0x30;
          if (9 < uVar3) {
            pcVar5 = (char *)error->_M_string_length;
            pcVar4 = "Rewrite schema error: \'\\\' must be followed by a digit or \'\\\'.";
            goto LAB_00136192;
          }
          if ((int)uVar6 <= (int)uVar3) {
            uVar6 = uVar3;
          }
          bVar1 = false;
        }
      }
      if (bVar1) break;
      pcVar9 = pcVar9 + 1;
      bVar10 = pcVar9 < pcVar8;
    } while (bVar10);
  }
  if (bVar10) {
    bVar10 = false;
  }
  else {
    iVar2 = NumberOfCapturingGroups(this);
    bVar10 = true;
    if (iVar2 < (int)uVar6) {
      uVar3 = NumberOfCapturingGroups(this);
      bVar10 = false;
      SStringPrintf(error,
                    "Rewrite schema requests %d matches, but the regexp only has %d parenthesized subexpressions."
                    ,(ulong)uVar6,(ulong)uVar3);
    }
  }
  return bVar10;
}

Assistant:

bool RE2::CheckRewriteString(const StringPiece& rewrite, string* error) const {
  int max_token = -1;
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    int c = *s;
    if (c != '\\') {
      continue;
    }
    if (++s == end) {
      *error = "Rewrite schema error: '\\' not allowed at end.";
      return false;
    }
    c = *s;
    if (c == '\\') {
      continue;
    }
    if (!isdigit(c)) {
      *error = "Rewrite schema error: "
               "'\\' must be followed by a digit or '\\'.";
      return false;
    }
    int n = (c - '0');
    if (max_token < n) {
      max_token = n;
    }
  }

  if (max_token > NumberOfCapturingGroups()) {
    SStringPrintf(error, "Rewrite schema requests %d matches, "
                  "but the regexp only has %d parenthesized subexpressions.",
                  max_token, NumberOfCapturingGroups());
    return false;
  }
  return true;
}